

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O3

Entry * cali::Entry::unpack(Entry *__return_storage_ptr__,CaliperMetadataAccessInterface *db,
                           uchar *buffer,size_t *inc)

{
  anon_union_8_7_33918203_for_value aVar1;
  int iVar2;
  undefined4 extraout_var;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  cali_variant_t cVar8;
  size_t local_28;
  Node *pNVar3;
  
  bVar4 = 0;
  lVar7 = 0;
  uVar5 = 0;
  do {
    bVar6 = buffer[lVar7];
    if (-1 < (char)bVar6) goto LAB_00187a04;
    uVar5 = uVar5 | (ulong)(bVar6 & 0x7f) << (bVar4 & 0x3f);
    lVar7 = lVar7 + 1;
    bVar4 = bVar4 + 7;
  } while (lVar7 != 9);
  bVar6 = buffer[9];
  lVar7 = 9;
LAB_00187a04:
  local_28 = lVar7 + 1U;
  iVar2 = (**db->_vptr_CaliperMetadataAccessInterface)
                    (db,(ulong)(bVar6 & 0x7f) << ((char)lVar7 * '\a' & 0x3fU) | uVar5);
  pNVar3 = (Node *)CONCAT44(extraout_var,iVar2);
  __return_storage_ptr__->m_node = pNVar3;
  aVar1 = (pNVar3->m_data).m_v.value;
  (__return_storage_ptr__->m_value).m_v.type_and_size = (pNVar3->m_data).m_v.type_and_size;
  (__return_storage_ptr__->m_value).m_v.value = aVar1;
  if (pNVar3->m_attribute == 8) {
    cVar8 = cali_variant_unpack(buffer + lVar7 + 1U,&local_28,(_Bool *)0x0);
    (__return_storage_ptr__->m_value).m_v = cVar8;
  }
  if (inc != (size_t *)0x0) {
    *inc = *inc + local_28;
  }
  return __return_storage_ptr__;
}

Assistant:

Entry Entry::unpack(const CaliperMetadataAccessInterface& db, const unsigned char* buffer, size_t* inc)
{
    size_t p = 0;
    Entry  ret { db.node(vldec_u64(buffer, &p)) };

    if (ret.m_node->attribute() == Attribute::NAME_ATTR_ID)
        ret.m_value = Variant::unpack(buffer + p, &p);

    if (inc)
        *inc += p;

    return ret;
}